

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureMultisampleTests::init
          (TextureMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int samples;
  uint uVar1;
  TestContext *testCtx;
  Context *context;
  char *__rhs;
  int extraout_EAX;
  TestNode *node;
  TestCase *pTVar2;
  SampleMaskCase *pSVar3;
  long lVar4;
  NegativeFramebufferCase *pNVar5;
  NegativeTexParameterCase *pNVar6;
  NegativeTexureSampleCase *pNVar7;
  bool bVar8;
  long lVar9;
  allocator<char> local_ad;
  int local_ac;
  TestNode *local_a8;
  long local_a0;
  long local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar9 = 0;
  while( true ) {
    node = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar9 == 10) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"samples_",&local_ad);
    local_a8 = node;
    de::toString<int>(&local_50,init::sampleCounts + lVar9);
    std::operator+(&local_90,&local_70,&local_50);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,local_90._M_dataplus._M_p,"Test with N samples");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    tcu::TestNode::addChild((TestNode *)this,node);
    pTVar2 = (TestCase *)operator_new(0xe8);
    samples = init::sampleCounts[lVar9];
    gles31::TestCase::TestCase
              (pTVar2,(this->super_TestCaseGroup).m_context,"sample_position","test SAMPLE_POSITION"
              );
    (pTVar2->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SamplePosRasterizationTest_01e520b8;
    *(int *)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode = samples;
    *(undefined4 *)((long)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x100;
    pTVar2[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pTVar2[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
    pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[4] = '\x01';
    *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    *(undefined4 *)&pTVar2[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
    pTVar2[1].super_TestCase.super_TestNode.m_children.
    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pTVar2[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
    pTVar2[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode.m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode.m_description.field_2 + 0xc) = 0;
    pTVar2[1].super_TestCase.super_TestNode.m_children.
    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
    *(undefined4 *)
     &pTVar2[1].super_TestCase.super_TestNode.m_children.
      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0xffffffff;
    tcu::TestNode::addChild(node,(TestNode *)pTVar2);
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_only",
               "Test with SampleMask only",samples,0);
    tcu::TestNode::addChild(node,(TestNode *)pSVar3);
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_and_alpha_to_coverage",
               "Test with SampleMask and alpha to coverage",samples,1);
    tcu::TestNode::addChild(node,(TestNode *)pSVar3);
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_and_sample_coverage",
               "Test with SampleMask and sample coverage",samples,2);
    tcu::TestNode::addChild(node,(TestNode *)pSVar3);
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,
               "sample_mask_and_sample_coverage_and_alpha_to_coverage",
               "Test with SampleMask, sample coverage, and alpha to coverage",samples,3);
    tcu::TestNode::addChild(node,(TestNode *)pSVar3);
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_non_effective_bits",
               "Test with SampleMask, set higher bits than sample count",samples,4);
    tcu::TestNode::addChild(node,(TestNode *)pSVar3);
    lVar4 = 0;
    local_ac = samples;
    local_98 = lVar9;
    while( true ) {
      if (lVar4 == 0x80) break;
      local_a0 = lVar4;
      pTVar2 = (TestCase *)operator_new(0xa0);
      context = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"use_",(allocator<char> *)&local_50);
      lVar9 = local_a0;
      __rhs = *(char **)((long)&init::textureTypes[0].name + local_a0);
      std::operator+(&local_90,&local_70,__rhs);
      uVar1 = *(uint *)((long)&init::textureTypes[0].type + lVar9);
      gles31::TestCase::TestCase(pTVar2,context,local_90._M_dataplus._M_p,__rhs);
      (pTVar2->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__MultisampleTextureUsageCase_01e52158;
      *(uint *)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      *(int *)((long)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = local_ac;
      pTVar2[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      pTVar2[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      pTVar2[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = uVar1 < 2;
      pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[1] =
           (uVar1 & 0xfffffffe) == 2;
      pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[2] =
           (uVar1 & 0xfffffffe) == 4;
      pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] =
           uVar1 == 6 || uVar1 == 7;
      if ((5 < uVar1) || (bVar8 = true, (0x2aU >> (uVar1 & 0x1f) & 1) == 0)) {
        bVar8 = uVar1 == 7;
      }
      pTVar2[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[4] = bVar8;
      tcu::TestNode::addChild(local_a8,(TestNode *)pTVar2);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      lVar4 = local_a0 + 0x10;
    }
    lVar9 = local_98 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,"negative","Negative tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  pNVar5 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar5,(this->super_TestCaseGroup).m_context,
             "fbo_attach_different_sample_count_tex_tex","Attach different sample counts",
             CASE_DIFFERENT_N_SAMPLES_TEX);
  tcu::TestNode::addChild(node,(TestNode *)pNVar5);
  pNVar5 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar5,(this->super_TestCaseGroup).m_context,
             "fbo_attach_different_sample_count_tex_rbo","Attach different sample counts",
             CASE_DIFFERENT_N_SAMPLES_RBO);
  tcu::TestNode::addChild(node,(TestNode *)pNVar5);
  pNVar5 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"fbo_attach_different_fixed_state_tex_tex"
             ,"Attach fixed and non fixed",CASE_DIFFERENT_FIXED_TEX);
  tcu::TestNode::addChild(node,(TestNode *)pNVar5);
  pNVar5 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"fbo_attach_different_fixed_state_tex_rbo"
             ,"Attach fixed and non fixed",CASE_DIFFERENT_FIXED_RBO);
  tcu::TestNode::addChild(node,(TestNode *)pNVar5);
  pNVar5 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"fbo_attach_non_zero_level",
             "Attach non-zero level",CASE_NON_ZERO_LEVEL);
  tcu::TestNode::addChild(node,(TestNode *)pNVar5);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_min_filter",
             "set TEXTURE_MIN_FILTER",TEXTURE_MIN_FILTER);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_mag_filter",
             "set TEXTURE_MAG_FILTER",TEXTURE_MAG_FILTER);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_wrap_s","set TEXTURE_WRAP_S",
             TEXTURE_WRAP_S);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_wrap_t","set TEXTURE_WRAP_T",
             TEXTURE_WRAP_T);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_wrap_r","set TEXTURE_WRAP_R",
             TEXTURE_WRAP_R);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_min_lod","set TEXTURE_MIN_LOD",
             TEXTURE_MIN_LOD);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_max_lod","set TEXTURE_MAX_LOD",
             TEXTURE_MAX_LOD);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_compare_mode",
             "set TEXTURE_COMPARE_MODE",TEXTURE_COMPARE_MODE);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_compare_func",
             "set TEXTURE_COMPARE_FUNC",TEXTURE_COMPARE_FUNC);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_base_level",
             "set TEXTURE_BASE_LEVEL",TEXTURE_BASE_LEVEL);
  tcu::TestNode::addChild(node,(TestNode *)pNVar6);
  pNVar7 = (NegativeTexureSampleCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexureSampleCase::NegativeTexureSampleCase
            (pNVar7,(this->super_TestCaseGroup).m_context,"texture_high_sample_count",
             "TexStorage with high numSamples",SAMPLECOUNT_HIGH);
  tcu::TestNode::addChild(node,(TestNode *)pNVar7);
  pNVar7 = (NegativeTexureSampleCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexureSampleCase::NegativeTexureSampleCase
            (pNVar7,(this->super_TestCaseGroup).m_context,"texture_zero_sample_count",
             "TexStorage with zero numSamples",SAMPLECOUNT_ZERO);
  tcu::TestNode::addChild(node,(TestNode *)pNVar7);
  return extraout_EAX;
}

Assistant:

void TextureMultisampleTests::init (void)
{
	static const int sampleCounts[] = { 1, 2, 3, 4, 8, 10, 12, 13, 16, 64 };

	static const struct TextureType
	{
		const char*									name;
		MultisampleTextureUsageCase::TextureType	type;
	} textureTypes[] =
	{
		{ "texture_color_2d",		MultisampleTextureUsageCase::TEXTURE_COLOR_2D		},
		{ "texture_color_2d_array",	MultisampleTextureUsageCase::TEXTURE_COLOR_2D_ARRAY	},
		{ "texture_int_2d",			MultisampleTextureUsageCase::TEXTURE_INT_2D			},
		{ "texture_int_2d_array",	MultisampleTextureUsageCase::TEXTURE_INT_2D_ARRAY	},
		{ "texture_uint_2d",		MultisampleTextureUsageCase::TEXTURE_UINT_2D		},
		{ "texture_uint_2d_array",	MultisampleTextureUsageCase::TEXTURE_UINT_2D_ARRAY	},
		{ "texture_depth_2d",		MultisampleTextureUsageCase::TEXTURE_DEPTH_2D		},
		{ "texture_depth_2d_array",	MultisampleTextureUsageCase::TEXTURE_DEPTH_2D_ARRAY	},
	};

	// .samples_x
	for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleNdx)
	{
		tcu::TestCaseGroup* const sampleGroup = new tcu::TestCaseGroup(m_testCtx, (std::string("samples_") + de::toString(sampleCounts[sampleNdx])).c_str(), "Test with N samples");
		addChild(sampleGroup);

		// position query works
		sampleGroup->addChild(new SamplePosRasterizationTest(m_context, "sample_position", "test SAMPLE_POSITION", sampleCounts[sampleNdx]));

		// sample mask is ANDed properly
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_only",											"Test with SampleMask only",									sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_NONE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_alpha_to_coverage",						"Test with SampleMask and alpha to coverage",					sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage",							"Test with SampleMask and sample coverage",						sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_SAMPLE_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage_and_alpha_to_coverage",	"Test with SampleMask, sample coverage, and alpha to coverage",	sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE | SampleMaskCase::FLAGS_SAMPLE_COVERAGE));

		// high bits cause no unexpected behavior
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_non_effective_bits",							"Test with SampleMask, set higher bits than sample count",		sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_HIGH_BITS));

		// usage
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(textureTypes); ++typeNdx)
			sampleGroup->addChild(new MultisampleTextureUsageCase(m_context, (std::string("use_") + textureTypes[typeNdx].name).c_str(), textureTypes[typeNdx].name, sampleCounts[sampleNdx], textureTypes[typeNdx].type));
	}

	// .negative
	{
		tcu::TestCaseGroup* const negativeGroup = new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests");
		addChild(negativeGroup);

		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_tex",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_rbo",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_tex",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_rbo",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_non_zero_level",					"Attach non-zero level",			NegativeFramebufferCase::CASE_NON_ZERO_LEVEL));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_filter",							"set TEXTURE_MIN_FILTER",			NegativeTexParameterCase::TEXTURE_MIN_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_mag_filter",							"set TEXTURE_MAG_FILTER",			NegativeTexParameterCase::TEXTURE_MAG_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_s",								"set TEXTURE_WRAP_S",				NegativeTexParameterCase::TEXTURE_WRAP_S));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_t",								"set TEXTURE_WRAP_T",				NegativeTexParameterCase::TEXTURE_WRAP_T));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_r",								"set TEXTURE_WRAP_R",				NegativeTexParameterCase::TEXTURE_WRAP_R));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_lod",								"set TEXTURE_MIN_LOD",				NegativeTexParameterCase::TEXTURE_MIN_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_max_lod",								"set TEXTURE_MAX_LOD",				NegativeTexParameterCase::TEXTURE_MAX_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_mode",							"set TEXTURE_COMPARE_MODE",			NegativeTexParameterCase::TEXTURE_COMPARE_MODE));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_func",							"set TEXTURE_COMPARE_FUNC",			NegativeTexParameterCase::TEXTURE_COMPARE_FUNC));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_base_level",							"set TEXTURE_BASE_LEVEL",			NegativeTexParameterCase::TEXTURE_BASE_LEVEL));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_high_sample_count",					"TexStorage with high numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_HIGH));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_zero_sample_count",					"TexStorage with zero numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_ZERO));
	}
}